

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O0

void __thiscall prevector_tests::prevector_tester<8U,_int>::test(prevector_tester<8U,_int> *this)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  long in_FS_OFFSET;
  Size s_1;
  int *v_3;
  reverse_view<std::ranges::ref_view<const_prevector<8U,_int,_unsigned_int,_int>_>_> *__range2_3;
  int *v_2;
  pretype *__range2_2;
  int *v_1;
  reverse_view<std::ranges::ref_view<prevector<8U,_int,_unsigned_int,_int>_>_> *__range2_1;
  int *v;
  pretype *__range2;
  size_t pos;
  Size s;
  pretype *const_pre_vector;
  DataStream ss2;
  DataStream ss1;
  reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::const_iterator> __end0_3;
  reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::const_iterator> __begin0_3;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::iterator> __end0_1;
  reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::iterator> __begin0_1;
  iterator __end0;
  iterator __begin0;
  undefined4 in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  size_type in_stack_fffffffffffffd74;
  const_iterator in_stack_fffffffffffffd78;
  prevector<8U,_int,_unsigned_int,_int> *in_stack_fffffffffffffd80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd98;
  iterator in_stack_fffffffffffffda0;
  iterator in_stack_fffffffffffffda8;
  undefined4 local_1cc;
  undefined4 local_14c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  prevector<8U,_int,_unsigned_int,_int>::size
            ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr);
  prevector_tester<8u,int>::local_check_equal<unsigned_long,unsigned_int>
            ((prevector_tester<8U,_int> *)in_stack_fffffffffffffd78.ptr,
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_stack_fffffffffffffd6c
            );
  std::vector<int,_std::allocator<int>_>::empty
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78.ptr);
  prevector<8U,_int,_unsigned_int,_int>::empty
            ((prevector<8U,_int,_unsigned_int,_int> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  prevector_tester<8u,int>::local_check_equal<bool,bool>
            ((prevector_tester<8U,_int> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false,false);
  local_14c = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    if (sVar3 <= local_14c) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78.ptr,
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    prevector<8U,_int,_unsigned_int,_int>::operator[]
              ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr,
               in_stack_fffffffffffffd74);
    local_check((prevector_tester<8U,_int> *)
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
    prevector<8U,_int,_unsigned_int,_int>::operator[]
              ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr,
               in_stack_fffffffffffffd74);
    prevector<8U,_int,_unsigned_int,_int>::begin
              ((prevector<8U,_int,_unsigned_int,_int> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    prevector<8U,_int,_unsigned_int,_int>::iterator::operator[]
              ((iterator *)in_stack_fffffffffffffd78.ptr,in_stack_fffffffffffffd74);
    local_check((prevector_tester<8U,_int> *)
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
    prevector<8U,_int,_unsigned_int,_int>::operator[]
              ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr,
               in_stack_fffffffffffffd74);
    prevector<8U,_int,_unsigned_int,_int>::begin
              ((prevector<8U,_int,_unsigned_int,_int> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    prevector<8U,_int,_unsigned_int,_int>::iterator::operator+
              ((iterator *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd6c);
    prevector<8U,_int,_unsigned_int,_int>::iterator::operator*
              ((iterator *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_check((prevector_tester<8U,_int> *)
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
    prevector<8U,_int,_unsigned_int,_int>::operator[]
              ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr,
               in_stack_fffffffffffffd74);
    prevector<8U,_int,_unsigned_int,_int>::end
              ((prevector<8U,_int,_unsigned_int,_int> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    prevector<8U,_int,_unsigned_int,_int>::iterator::operator+
              ((iterator *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd6c);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    prevector<8U,_int,_unsigned_int,_int>::iterator::operator-
              ((iterator *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd6c);
    prevector<8U,_int,_unsigned_int,_int>::iterator::operator*
              ((iterator *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_check((prevector_tester<8U,_int> *)
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
    local_14c = local_14c + 1;
  }
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  prevector<8U,_int,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
            ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr,
             in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  prevector<8U,_int,_unsigned_int,_int>::operator==
            (in_stack_fffffffffffffd80,
             (prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr);
  local_check((prevector_tester<8U,_int> *)
              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
  prevector<8U,_int,_unsigned_int,_int>::~prevector
            ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr);
  prevector<8U,_int,_unsigned_int,_int>::begin
            ((prevector<8U,_int,_unsigned_int,_int> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  prevector<8U,_int,_unsigned_int,_int>::end
            ((prevector<8U,_int,_unsigned_int,_int> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  prevector<8U,_int,_unsigned_int,_int>::prevector<prevector<8U,_int,_unsigned_int,_int>::iterator>
            ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr,
             in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  prevector<8U,_int,_unsigned_int,_int>::operator==
            (in_stack_fffffffffffffd80,
             (prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr);
  local_check((prevector_tester<8U,_int> *)
              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
  prevector<8U,_int,_unsigned_int,_int>::~prevector
            ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr);
  prevector<8U,_int,_unsigned_int,_int>::begin
            ((prevector<8U,_int,_unsigned_int,_int> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  prevector<8U,_int,_unsigned_int,_int>::end
            ((prevector<8U,_int,_unsigned_int,_int> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  while( true ) {
    bVar2 = prevector<8U,_int,_unsigned_int,_int>::iterator::operator!=
                      ((iterator *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       (iterator)in_stack_fffffffffffffd78.ptr);
    if (!bVar2) break;
    prevector<8U,_int,_unsigned_int,_int>::iterator::operator*
              ((iterator *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78.ptr,
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    local_check((prevector_tester<8U,_int> *)
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
    prevector<8U,_int,_unsigned_int,_int>::iterator::operator++
              ((iterator *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  }
  std::ranges::views::__adaptor::
  operator|<const_std::ranges::views::_Reverse_&,_prevector<8U,_int,_unsigned_int,_int>_&>
            ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr,
             (_Reverse *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  std::ranges::reverse_view<std::ranges::ref_view<prevector<8U,_int,_unsigned_int,_int>_>_>::begin
            ((reverse_view<std::ranges::ref_view<prevector<8U,_int,_unsigned_int,_int>_>_> *)
             in_stack_fffffffffffffd80);
  std::ranges::reverse_view<std::ranges::ref_view<prevector<8U,_int,_unsigned_int,_int>_>_>::end
            ((reverse_view<std::ranges::ref_view<prevector<8U,_int,_unsigned_int,_int>_>_> *)
             in_stack_fffffffffffffd80);
  while( true ) {
    bVar2 = std::operator==<prevector<8U,_int,_unsigned_int,_int>::iterator>
                      ((reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::iterator> *)
                       in_stack_fffffffffffffd80,
                       (reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::iterator> *)
                       in_stack_fffffffffffffd78.ptr);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::iterator>::operator*
              ((reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::iterator> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78.ptr,
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    local_check((prevector_tester<8U,_int> *)
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
    std::reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::iterator>::operator++
              ((reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::iterator> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  }
  prevector<8U,_int,_unsigned_int,_int>::begin
            ((prevector<8U,_int,_unsigned_int,_int> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  prevector<8U,_int,_unsigned_int,_int>::end
            ((prevector<8U,_int,_unsigned_int,_int> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  while( true ) {
    bVar2 = prevector<8U,_int,_unsigned_int,_int>::const_iterator::operator!=
                      ((const_iterator *)
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       in_stack_fffffffffffffd78);
    if (!bVar2) break;
    prevector<8U,_int,_unsigned_int,_int>::const_iterator::operator*
              ((const_iterator *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78.ptr,
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    local_check((prevector_tester<8U,_int> *)
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
    prevector<8U,_int,_unsigned_int,_int>::const_iterator::operator++
              ((const_iterator *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  }
  std::ranges::views::__adaptor::
  operator|<const_std::ranges::views::_Reverse_&,_const_prevector<8U,_int,_unsigned_int,_int>_&>
            ((prevector<8U,_int,_unsigned_int,_int> *)in_stack_fffffffffffffd78.ptr,
             (_Reverse *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  std::ranges::reverse_view<std::ranges::ref_view<const_prevector<8U,_int,_unsigned_int,_int>_>_>::
  begin((reverse_view<std::ranges::ref_view<const_prevector<8U,_int,_unsigned_int,_int>_>_> *)
        in_stack_fffffffffffffd80);
  std::ranges::reverse_view<std::ranges::ref_view<const_prevector<8U,_int,_unsigned_int,_int>_>_>::
  end((reverse_view<std::ranges::ref_view<const_prevector<8U,_int,_unsigned_int,_int>_>_> *)
      in_stack_fffffffffffffd80);
  while( true ) {
    bVar2 = std::operator==<prevector<8U,_int,_unsigned_int,_int>::const_iterator>
                      ((reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::const_iterator> *)
                       in_stack_fffffffffffffd80,
                       (reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::const_iterator> *)
                       in_stack_fffffffffffffd78.ptr);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::const_iterator>::operator*
              ((reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::const_iterator> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78.ptr,
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    local_check((prevector_tester<8U,_int> *)
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
    std::reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::const_iterator>::operator++
              ((reverse_iterator<prevector<8U,_int,_unsigned_int,_int>::const_iterator> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  }
  DataStream::DataStream
            ((DataStream *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  DataStream::DataStream
            ((DataStream *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffd78.ptr,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffd78.ptr,
             (prevector<8U,_int,_unsigned_int,_int> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  DataStream::size((DataStream *)in_stack_fffffffffffffd78.ptr);
  DataStream::size((DataStream *)in_stack_fffffffffffffd78.ptr);
  prevector_tester<8u,int>::local_check_equal<unsigned_long,unsigned_long>
            ((prevector_tester<8U,_int> *)in_stack_fffffffffffffd78.ptr,
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  local_1cc = 0;
  while( true ) {
    sVar4 = DataStream::size((DataStream *)in_stack_fffffffffffffd78.ptr);
    if (sVar4 <= local_1cc) break;
    pvVar5 = DataStream::operator[]
                       ((DataStream *)in_stack_fffffffffffffd78.ptr,
                        CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    in_stack_fffffffffffffd74 = CONCAT13(*pvVar5,(int3)in_stack_fffffffffffffd74);
    in_stack_fffffffffffffd78.ptr =
         (int *)DataStream::operator[]
                          (in_stack_fffffffffffffd78.ptr,
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    prevector_tester<8u,int>::local_check_equal<std::byte,std::byte>
              ((prevector_tester<8U,_int> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),0,0);
    local_1cc = local_1cc + 1;
  }
  DataStream::~DataStream
            ((DataStream *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  DataStream::~DataStream
            ((DataStream *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void test() {
        const pretype& const_pre_vector = pre_vector;
        local_check_equal(real_vector.size(), pre_vector.size());
        local_check_equal(real_vector.empty(), pre_vector.empty());
        for (Size s = 0; s < real_vector.size(); s++) {
             local_check(real_vector[s] == pre_vector[s]);
             local_check(&(pre_vector[s]) == &(pre_vector.begin()[s]));
             local_check(&(pre_vector[s]) == &*(pre_vector.begin() + s));
             local_check(&(pre_vector[s]) == &*((pre_vector.end() + s) - real_vector.size()));
        }
        // local_check(realtype(pre_vector) == real_vector);
        local_check(pretype(real_vector.begin(), real_vector.end()) == pre_vector);
        local_check(pretype(pre_vector.begin(), pre_vector.end()) == pre_vector);
        size_t pos = 0;
        for (const T& v : pre_vector) {
             local_check(v == real_vector[pos++]);
        }
        for (const T& v : pre_vector | std::views::reverse) {
            local_check(v == real_vector[--pos]);
        }
        for (const T& v : const_pre_vector) {
             local_check(v == real_vector[pos++]);
        }
        for (const T& v : const_pre_vector | std::views::reverse) {
            local_check(v == real_vector[--pos]);
        }
        DataStream ss1{};
        DataStream ss2{};
        ss1 << real_vector;
        ss2 << pre_vector;
        local_check_equal(ss1.size(), ss2.size());
        for (Size s = 0; s < ss1.size(); s++) {
            local_check_equal(ss1[s], ss2[s]);
        }
    }